

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O0

int coda_ascbin_cursor_get_array_dim(coda_cursor_conflict *cursor,int *num_dims,long *dim)

{
  int iVar1;
  coda_type *local_60;
  char local_58 [8];
  char s [21];
  int64_t var_dim;
  int i;
  coda_type_array *array;
  long *dim_local;
  int *num_dims_local;
  coda_cursor_conflict *cursor_local;
  
  if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
    local_60 = (coda_type *)cursor->stack[cursor->n + -1].type;
  }
  else {
    local_60 = (cursor->stack[cursor->n + -1].type)->definition;
  }
  *num_dims = *(int *)&local_60[1].name;
  var_dim._4_4_ = 0;
  do {
    if (*(int *)&local_60[1].name <= (int)var_dim._4_4_) {
      return 0;
    }
    if ((&local_60[1].description)[(int)var_dim._4_4_] == (char *)0xffffffffffffffff) {
      iVar1 = coda_expression_eval_integer
                        ((coda_expression *)(&local_60[2].bit_size)[(int)var_dim._4_4_],cursor,
                         (int64_t *)(s + 0x10));
      if (iVar1 != 0) {
        coda_add_error_message(" for dim[%d] expression",(ulong)var_dim._4_4_);
        coda_cursor_add_to_error_message(cursor);
        return -1;
      }
      if (stack0xffffffffffffffc0 < 0) {
        coda_str64(stack0xffffffffffffffc0,local_58);
        coda_set_error(-300,"product error detected (invalid array size (%s))",local_58);
        coda_cursor_add_to_error_message(cursor);
        return -1;
      }
      dim[(int)var_dim._4_4_] = stack0xffffffffffffffc0;
    }
    else {
      dim[(int)var_dim._4_4_] = (long)(&local_60[1].description)[(int)var_dim._4_4_];
    }
    var_dim._4_4_ = var_dim._4_4_ + 1;
  } while( true );
}

Assistant:

int coda_ascbin_cursor_get_array_dim(const coda_cursor *cursor, int *num_dims, long dim[])
{
    coda_type_array *array = (coda_type_array *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    int i;

    *num_dims = array->num_dims;
    for (i = 0; i < array->num_dims; i++)
    {
        if (array->dim[i] == -1)
        {
            int64_t var_dim;

            if (coda_expression_eval_integer(array->dim_expr[i], cursor, &var_dim) != 0)
            {
                coda_add_error_message(" for dim[%d] expression", i);
                coda_cursor_add_to_error_message(cursor);
                return -1;
            }
            if (var_dim < 0)
            {
                char s[21];

                coda_str64(var_dim, s);
                coda_set_error(CODA_ERROR_PRODUCT, "product error detected (invalid array size (%s))", s);
                coda_cursor_add_to_error_message(cursor);
                return -1;
            }
            dim[i] = (long)var_dim;
        }
        else
        {
            dim[i] = array->dim[i];
        }
    }

    return 0;
}